

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void P_SerializeSounds(FSerializer *arc)

{
  bool bVar1;
  int iVar2;
  FSerializer *arc_00;
  BYTE order;
  char *name;
  byte local_11;
  char *local_10;
  
  S_SerializeSounds(arc);
  DSeqNode::SerializeSequences(arc);
  local_10 = (char *)0x0;
  if (arc->w != (FWriter *)0x0) {
    iVar2 = S_GetMusic(&local_10);
    local_11 = (byte)iVar2;
  }
  arc_00 = FSerializer::StringPtr(arc,"musicname",&local_10);
  Serialize(arc_00,"musicorder",&local_11,(uint8_t *)0x0);
  if ((arc->r != (FReader *)0x0) &&
     (bVar1 = S_ChangeMusic(local_10,(uint)local_11,true,false), !bVar1)) {
    if ((level.cdtrack != 0) && (bVar1 = S_ChangeCDMusic(level.cdtrack,level.cdid,true), bVar1)) {
      return;
    }
    S_ChangeMusic(level.Music.Chars,level.musicorder,true,false);
  }
  return;
}

Assistant:

void P_SerializeSounds(FSerializer &arc)
{
	S_SerializeSounds(arc);
	DSeqNode::SerializeSequences (arc);
	const char *name = NULL;
	BYTE order;

	if (arc.isWriting())
	{
		order = S_GetMusic(&name);
	}
	arc.StringPtr("musicname", name)
		("musicorder", order);

	if (arc.isReading())
	{
		if (!S_ChangeMusic(name, order))
			if (level.cdtrack == 0 || !S_ChangeCDMusic(level.cdtrack, level.cdid))
				S_ChangeMusic(level.Music, level.musicorder);
	}
}